

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

void Acb_ObjPushToFanout(Acb_Ntk_t *p,int iObj,int iFaninIndex,int iFanout)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint iFanin;
  int *piVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  word *pwVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  int local_50;
  
  if (0 < iObj) {
    iVar3 = (p->vObjTruth).nSize;
    if (iVar3 < 1) {
      pcVar16 = "Acb_NtkHasObjTruths(p)";
      goto LAB_0037f722;
    }
    if (iVar3 <= iObj) {
LAB_0037f69f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if (0 < iFanout) {
      if (iFanout < iVar3) {
        if (5 < (uint)iFaninIndex) {
LAB_0037f6be:
          __assert_fail("iVar >= 0 && iVar < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x240,"word Abc_Tt6Cofactor0(word, int)");
        }
        pwVar15 = (p->vObjTruth).pArray;
        uVar18 = pwVar15[(uint)iObj];
        uVar9 = (ulong)(uint)iFaninIndex;
        uVar14 = s_Truths6Neg[uVar9] & uVar18;
        bVar10 = (byte)(1 << ((byte)iFaninIndex & 0x1f));
        uVar18 = uVar18 & s_Truths6[uVar9];
        uVar14 = uVar14 << (bVar10 & 0x3f) | uVar14;
        uVar18 = uVar18 >> (bVar10 & 0x3f) | uVar18;
        if (uVar14 == uVar18) {
          __assert_fail("c0 != c1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x95b,"int Abc_Tt6CheckOutDec(word, int, word *)");
        }
        if (uVar14 == 0) {
          local_50 = 0;
          uVar14 = uVar18;
        }
        else if (uVar18 == 0) {
          local_50 = 1;
        }
        else if (uVar14 == 0xffffffffffffffff) {
          local_50 = 2;
          uVar14 = uVar18;
        }
        else if (uVar18 == 0xffffffffffffffff) {
          local_50 = 3;
        }
        else {
          bVar21 = (uVar18 ^ uVar14) == 0xffffffffffffffff;
          uVar18 = 0;
          if (bVar21) {
            uVar18 = uVar14;
          }
          local_50 = (uint)bVar21 * 5 + -1;
          uVar14 = uVar18;
        }
        iVar3 = (p->vObjFans).nSize;
        if (iVar3 <= iObj) {
LAB_0037f674:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = (p->vObjFans).pArray;
        iVar4 = piVar6[(uint)iObj];
        if ((-1 < (long)iVar4) && (iVar5 = (p->vFanSto).nSize, iVar4 < iVar5)) {
          if (iVar3 <= iFanout) goto LAB_0037f674;
          iVar3 = piVar6[(uint)iFanout];
          if ((-1 < (long)iVar3) && (iVar3 < iVar5)) {
            uVar18 = pwVar15[(uint)iFanout];
            piVar7 = (p->vFanSto).pArray;
            piVar6 = piVar7 + iVar4;
            iFanin = piVar6[uVar9 + 1];
            puVar2 = (uint *)(piVar7 + iVar3);
            uVar13 = *puVar2;
            uVar17 = 0;
            uVar19 = 0;
            if (0 < (int)uVar13) {
              uVar19 = (ulong)uVar13;
            }
            do {
              if (uVar19 == uVar17) {
                uVar12 = 0xffffffff;
                goto LAB_0037f39b;
              }
              uVar1 = uVar17 + 1;
              lVar8 = uVar17 + 1;
              uVar17 = uVar1;
            } while (puVar2[lVar8] != iObj);
            uVar12 = (int)uVar1 - 1;
LAB_0037f39b:
            uVar17 = 0;
            do {
              if (uVar19 == uVar17) {
                uVar20 = 0xffffffff;
                goto LAB_0037f3bb;
              }
              uVar1 = uVar17 + 1;
              lVar8 = uVar17 + 1;
              uVar17 = uVar1;
            } while (puVar2[lVar8] != iFanin);
            uVar20 = (int)uVar1 - 1;
LAB_0037f3bb:
            if (uVar20 != 0xffffffff) {
              uVar13 = uVar20;
            }
            iVar3 = (p->vObjType).nSize;
            if (iObj < iVar3) {
              pcVar16 = (p->vObjType).pArray;
              if (0xfd < (byte)(pcVar16[(uint)iObj] - 5U)) {
                __assert_fail("!Acb_ObjIsCio(p, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                              ,0x37,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
              }
              if (iFanout < iVar3) {
                if (0xfd < (byte)(pcVar16[(uint)iFanout] - 5U)) {
                  __assert_fail("!Acb_ObjIsCio(p, iFanout)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x38,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if ((int)uVar13 < 0) {
                  __assert_fail("iFanoutFaninIndex >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x39,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if (*piVar6 <= iFaninIndex) {
                  __assert_fail("iFaninIndex < Acb_ObjFaninNum(p, iObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x3a,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if ((p->vFanouts).nSize <= iObj) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                }
                if ((p->vFanouts).pArray[(uint)iObj].nSize != 1) {
                  __assert_fail("Acb_ObjFanoutNum(p, iObj) == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x3b,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if (5 < uVar12) goto LAB_0037f6be;
                uVar17 = s_Truths6Neg[uVar12] & uVar18;
                bVar11 = (byte)(1 << ((byte)uVar12 & 0x1f));
                uVar18 = uVar18 & s_Truths6[uVar12];
                switch(local_50) {
                case 0:
                  uVar19 = s_Truths6[uVar12] & s_Truths6[uVar13];
                  break;
                case 1:
                  uVar19 = ~s_Truths6[uVar13] & s_Truths6[uVar12];
                  break;
                case 2:
                  uVar19 = ~s_Truths6[uVar13] | s_Truths6[uVar12];
                  break;
                case 3:
                  uVar19 = s_Truths6[uVar12] | s_Truths6[uVar13];
                  break;
                case 4:
                  uVar19 = s_Truths6[uVar12] ^ s_Truths6[uVar13];
                  break;
                default:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                                ,0x49,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
                }
                if ((s_Truths6Neg[uVar9] & (uVar14 >> (bVar10 & 0x3f) ^ uVar14)) != 0) {
                  __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                ,0x5d4,"word Abc_Tt6RemoveVar(word, int)");
                }
                if (iFaninIndex != 5) {
                  pwVar15 = s_PMasks[uVar9] + 2;
                  do {
                    uVar1 = uVar9 + 1;
                    bVar10 = (byte)(1 << ((byte)uVar9 & 0x1f));
                    uVar14 = (uVar14 & *pwVar15) >> (bVar10 & 0x3f) |
                             (pwVar15[-1] & uVar14) << (bVar10 & 0x3f) |
                             (*(word (*) [3])(pwVar15 + -2))[0] & uVar14;
                    pwVar15 = pwVar15 + 3;
                    uVar9 = uVar1;
                  } while ((int)uVar1 != 5);
                }
                iVar3 = (p->vObjTruth).nSize;
                if (iObj < iVar3) {
                  pwVar15 = (p->vObjTruth).pArray;
                  pwVar15[(uint)iObj] = uVar14;
                  if (iFanout < iVar3) {
                    uVar17 = uVar17 << (bVar11 & 0x3f) | uVar17;
                    pwVar15[(uint)iFanout] =
                         ((uVar18 >> (bVar11 & 0x3f) | uVar18) ^ uVar17) & uVar19 ^ uVar17;
                    Acb_ObjRemoveFaninFanoutOne(p,iObj,iFanin);
                    if ((p->vObjFans).nSize <= iFanout) goto LAB_0037f674;
                    iVar3 = (p->vObjFans).pArray[(uint)iFanout];
                    if ((-1 < (long)iVar3) && (iVar3 < (p->vFanSto).nSize)) {
                      if (uVar13 != (p->vFanSto).pArray[iVar3]) {
                        return;
                      }
                      Acb_ObjAddFaninFanoutOne(p,iFanout,iFanin);
                      return;
                    }
                    goto LAB_0037f655;
                  }
                }
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
              }
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
        }
LAB_0037f655:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      goto LAB_0037f69f;
    }
  }
  pcVar16 = "i>0";
LAB_0037f722:
  __assert_fail(pcVar16,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Pushing logic to the fanout.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acb_ObjPushToFanout( Acb_Ntk_t * p, int iObj, int iFaninIndex, int iFanout )
{
    word c0, uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj ), Gate;
    word c1, uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanout );
    int DecType = Abc_Tt6CheckOutDec( uTruthObj, iFaninIndex, &uTruthObjNew );
    int iFanin = Acb_ObjFanin( p, iObj, iFaninIndex );
    int iFanoutObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
    int iFanoutFaninIndex = Acb_ObjWhatFanin( p, iFanout, iFanin );
    if ( iFanoutFaninIndex == -1 )
        iFanoutFaninIndex = Acb_ObjFaninNum(p, iFanout); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanout) );
    assert( iFanoutFaninIndex >= 0 );
    assert( iFaninIndex < Acb_ObjFaninNum(p, iObj) );
    assert( Acb_ObjFanoutNum(p, iObj) == 1 );
    // compute new function of the fanout
    c0 = Abc_Tt6Cofactor0( uTruthFan, iFanoutObjIndex );
    c1 = Abc_Tt6Cofactor1( uTruthFan, iFanoutObjIndex );
    if ( DecType == 0 ) //  F = i * G
        Gate =  s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 1 ) //  F = ~i * G
        Gate = ~s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 2 ) //  F = ~i + G
        Gate = ~s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 3 ) //  F = i + G
        Gate =  s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 4 ) //  F = i # G
        Gate =  s_Truths6[iFanoutFaninIndex] ^ s_Truths6[iFanoutObjIndex];
    else assert( 0 );
    uTruthFanNew = (~Gate & c0) | (Gate & c1);
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanout, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin );
    if ( iFanoutFaninIndex == Acb_ObjFaninNum(p, iFanout) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanout, iFanin );
}